

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O3

string * __thiscall
soul::makeUID_abi_cxx11_(string *__return_storage_ptr__,soul *this,ModuleBase *m)

{
  soul *this_00;
  long *plVar1;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar2;
  long *plVar3;
  string_view name;
  long local_b8;
  long lStack_b0;
  undefined1 local_a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  IdentifierPath local_68;
  
  (**(code **)(*(long *)this + 0x70))(&local_68);
  IdentifierPath::toString_abi_cxx11_((string *)local_a8,&local_68);
  Program::stripRootNamespaceFromQualifiedPath((string *)&local_88,(string *)local_a8);
  plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_88,0,(char *)0x0,0x27f91f);
  name._M_str = plVar1 + 2;
  if ((long *)*plVar1 == name._M_str) {
    local_b8 = *name._M_str;
    lStack_b0 = plVar1[3];
    plVar3 = &local_b8;
  }
  else {
    local_b8 = *name._M_str;
    plVar3 = (long *)*plVar1;
  }
  this_00 = (soul *)plVar1[1];
  *plVar1 = (long)name._M_str;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  name._M_len = (size_t)plVar3;
  makeUID_abi_cxx11_(__return_storage_ptr__,this_00,name);
  if (plVar3 != &local_b8) {
    operator_delete(plVar3,local_b8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_allocated_capacity != &local_78) {
    operator_delete((void *)local_88._M_allocated_capacity,local_78._M_allocated_capacity + 1);
  }
  psVar2 = (string *)(local_a8 + 0x10);
  if ((string *)local_a8._0_8_ != psVar2) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    psVar2 = extraout_RAX;
  }
  local_68.pathSections.numActive = 0;
  if ((8 < local_68.pathSections.numAllocated) && (local_68.pathSections.items != (Identifier *)0x0)
     ) {
    operator_delete__(local_68.pathSections.items);
    psVar2 = extraout_RAX_00;
  }
  return psVar2;
}

Assistant:

static std::string makeUID (AST::ModuleBase& m)             { return makeUID ("mod_" + Program::stripRootNamespaceFromQualifiedPath (m.getFullyQualifiedDisplayPath().toString())); }